

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fl_utf.c
# Opt level: O3

wchar_t fl_utf8test(char *src,uint srclen)

{
  undefined8 in_RAX;
  wchar_t wVar1;
  char *end;
  wchar_t len;
  undefined8 uStack_28;
  
  if (srclen == 0) {
    wVar1 = L'\x01';
  }
  else {
    end = src + srclen;
    wVar1 = L'\x01';
    uStack_28 = in_RAX;
    do {
      if (*src < '\0') {
        fl_utf8decode(src,end,(wchar_t *)((long)&uStack_28 + 4));
        if (wVar1 < uStack_28._4_4_) {
          wVar1 = uStack_28._4_4_;
        }
        if ((long)uStack_28._4_4_ < 2) {
          return L'\0';
        }
        src = src + uStack_28._4_4_;
      }
      else {
        src = src + 1;
      }
    } while (src < end);
  }
  return wVar1;
}

Assistant:

int fl_utf8test(const char* src, unsigned srclen) {
  int ret = 1;
  const char* p = src;
  const char* e = src+srclen;
  while (p < e) {
    if (*p & 0x80) {
      int len; fl_utf8decode(p,e,&len);
      if (len < 2) return 0;
      if (len > ret) ret = len;
      p += len;
    } else {
      p++;
    }
  }
  return ret;
}